

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_fixed.hpp
# Opt level: O0

void __thiscall
protozero::fixed_size_buffer_adaptor::erase_range
          (fixed_size_buffer_adaptor *this,size_t from,size_t to)

{
  assert_error *paVar1;
  size_t to_local;
  size_t from_local;
  fixed_size_buffer_adaptor *this_local;
  
  if (this->m_size < from) {
    paVar1 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar1,"from <= m_size");
    __cxa_throw(paVar1,&assert_error::typeinfo,assert_error::~assert_error);
  }
  if (this->m_size < to) {
    paVar1 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar1,"to <= m_size");
    __cxa_throw(paVar1,&assert_error::typeinfo,assert_error::~assert_error);
  }
  if (to <= from) {
    paVar1 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(paVar1,"from < to");
    __cxa_throw(paVar1,&assert_error::typeinfo,assert_error::~assert_error);
  }
  std::copy<char*,char*>(this->m_data + to,this->m_data + this->m_size,this->m_data + from);
  this->m_size = this->m_size - (to - from);
  return;
}

Assistant:

void erase_range(std::size_t from, std::size_t to) {
        protozero_assert(from <= m_size);
        protozero_assert(to <= m_size);
        protozero_assert(from < to);
        std::copy(m_data + to, m_data + m_size, m_data + from);
        m_size -= (to - from);
    }